

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

Schema __thiscall capnp::SchemaLoader::load(SchemaLoader *this,Reader *reader)

{
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> *this_00;
  Impl *this_01;
  RawSchema *pRVar1;
  Reader *local_20;
  Reader *reader_local;
  SchemaLoader *this_local;
  
  local_20 = reader;
  reader_local = (Reader *)this;
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
             &stack0xffffffffffffffd0,this);
  this_00 = kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::operator->
                      ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)
                       &stack0xffffffffffffffd0);
  this_01 = kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::get(this_00);
  pRVar1 = Impl::load(this_01,local_20,false);
  Schema::Schema((Schema *)&this_local,&pRVar1->defaultBrand);
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)&stack0xffffffffffffffd0
            );
  return (Schema)(RawBrandedSchema *)this_local;
}

Assistant:

Schema SchemaLoader::load(const schema::Node::Reader& reader) {
  return Schema(&impl.lockExclusive()->get()->load(reader, false)->defaultBrand);
}